

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O0

bool __thiscall spv::Builder::isBoolType(Builder *this,Id typeId)

{
  Id IVar1;
  Id IVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  reference ppIVar5;
  bool local_1d;
  key_type local_1c [2];
  Id local_14;
  Builder *pBStack_10;
  Id typeId_local;
  Builder *this_local;
  
  local_1c[1] = 0x14;
  local_14 = typeId;
  pBStack_10 = this;
  pmVar3 = std::
           unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
           ::operator[](&this->groupedTypes,local_1c + 1);
  sVar4 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar3);
  IVar1 = local_14;
  local_1d = false;
  if (sVar4 != 0) {
    local_1c[0] = 0x14;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_1c);
    ppIVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::back(pmVar3);
    IVar2 = spv::Instruction::getResultId(*ppIVar5);
    local_1d = IVar1 == IVar2;
  }
  return local_1d;
}

Assistant:

bool isBoolType(Id typeId)
        { return groupedTypes[OpTypeBool].size() > 0 && typeId == groupedTypes[OpTypeBool].back()->getResultId(); }